

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mbc2.c
# Opt level: O0

gbstatus_e mbc2_init(gb_cart_t *cart)

{
  void *pvVar1;
  bool bVar2;
  gbstatus_e status;
  gb_cart_t *cart_local;
  
  if (cart == (gb_cart_t *)0x0) {
    __assert_fail("cart != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/loochek[P]gameboy/src/core/mbc2.c"
                  ,0x13,"gbstatus_e mbc2_init(gb_cart_t *)");
  }
  pvVar1 = calloc(1,1);
  cart->mbc_state = pvVar1;
  bVar2 = cart->mbc_state == (void *)0x0;
  if (bVar2) {
    snprintf(gbstatus_str,100,"unable to allocate memory");
  }
  cart_local._4_4_ = (gbstatus_e)bVar2;
  return cart_local._4_4_;
}

Assistant:

gbstatus_e mbc2_init(gb_cart_t *cart)
{
    gbstatus_e status = GBSTATUS_OK;

    assert(cart != NULL);

    cart->mbc_state = calloc(1, sizeof(mbc2_state_t));
    if (cart->mbc_state == NULL)
    {
        GBSTATUS(GBSTATUS_BAD_ALLOC, "unable to allocate memory");
        return status;
    }

    return GBSTATUS_OK;
}